

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::SpecifyConditionVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
          (SpecifyConditionVisitor *this,UnbasedUnsizedIntegerLiteral *expr)

{
  ExpressionKind EVar1;
  int iVar2;
  bool bVar3;
  Symbol *pSVar4;
  Diagnostic *this_00;
  
  bVar3 = Expression::bad(&expr->super_Expression);
  if (bVar3) {
    return;
  }
  EVar1 = (expr->super_Expression).kind;
  switch(EVar1) {
  case IntegerLiteral:
  case RealLiteral:
  case ConditionalOp:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case Call:
    goto switchD_003827dc_caseD_1;
  case TimeLiteral:
  case UnbasedUnsizedIntegerLiteral:
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case HierarchicalValue:
  case Inside:
  case Assignment:
  case Streaming:
  case MemberAccess:
    break;
  case NamedValue:
    pSVar4 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (pSVar4 == (Symbol *)0x0) {
      return;
    }
    if (pSVar4->kind - Net < 2) {
      if (pSVar4->parentScope == this->specifyParentScope) {
        return;
      }
    }
    else if (pSVar4->kind == Specparam) {
      return;
    }
    this_00 = ASTContext::addDiag(this->context,(DiagCode)0x980007,
                                  (expr->super_Expression).sourceRange);
    Diagnostic::operator<<(this_00,pSVar4->name);
    Diagnostic::addNote(this_00,(DiagCode)0x50001,pSVar4->location);
    return;
  case UnaryOp:
    if (*(int *)&expr->value - 2U < 8) {
      return;
    }
    break;
  case BinaryOp:
    iVar2 = *(int *)&expr[1].super_Expression.type.ptr;
    if (iVar2 - 5U < 6) {
      return;
    }
    if (iVar2 - 0x13U < 2) {
      return;
    }
    break;
  case Conversion:
    if (*(int *)&expr->value < 2) {
      return;
    }
    break;
  default:
    if (EVar1 == MinTypMax) {
      return;
    }
  }
  if (this->hasWarned == false) {
    ASTContext::addDiag(this->context,(DiagCode)0xd60007,(expr->super_Expression).sourceRange);
    this->hasWarned = true;
  }
switchD_003827dc_caseD_1:
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.bad())
                return;

            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        // Specparams are always allowed.
                        if (sym->kind == SymbolKind::Specparam)
                            break;

                        // Other references must be locally defined nets or variables.
                        if ((sym->kind != SymbolKind::Net && sym->kind != SymbolKind::Variable) ||
                            sym->getParentScope() != specifyParentScope) {
                            auto& diag = context.addDiag(diag::SpecifyPathBadReference,
                                                         expr.sourceRange);
                            diag << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect:
                case ExpressionKind::Call:
                case ExpressionKind::MinTypMax:
                case ExpressionKind::Concatenation:
                case ExpressionKind::Replication:
                case ExpressionKind::ConditionalOp:
                case ExpressionKind::UnaryOp:
                case ExpressionKind::BinaryOp:
                case ExpressionKind::Conversion:
                    if constexpr (HasVisitExprs<T, SpecifyConditionVisitor>)
                        expr.visitExprs(*this);

                    if (expr.kind == ExpressionKind::UnaryOp) {
                        switch (expr.template as<UnaryExpression>().op) {
                            case UnaryOperator::BitwiseNot:
                            case UnaryOperator::BitwiseAnd:
                            case UnaryOperator::BitwiseOr:
                            case UnaryOperator::BitwiseXor:
                            case UnaryOperator::BitwiseNand:
                            case UnaryOperator::BitwiseNor:
                            case UnaryOperator::BitwiseXnor:
                            case UnaryOperator::LogicalNot:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::BinaryOp) {
                        switch (expr.template as<BinaryExpression>().op) {
                            case BinaryOperator::BinaryAnd:
                            case BinaryOperator::BinaryOr:
                            case BinaryOperator::BinaryXor:
                            case BinaryOperator::BinaryXnor:
                            case BinaryOperator::Equality:
                            case BinaryOperator::Inequality:
                            case BinaryOperator::LogicalAnd:
                            case BinaryOperator::LogicalOr:
                                break;
                            default:
                                reportError(expr.sourceRange);
                        }
                    }
                    else if (expr.kind == ExpressionKind::Conversion) {
                        if (!expr.template as<ConversionExpression>().isImplicit())
                            reportError(expr.sourceRange);
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                case ExpressionKind::RealLiteral:
                    break;
                default:
                    reportError(expr.sourceRange);
                    break;
            }
        }
    }